

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O0

iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_>
__thiscall
google::protobuf::internal::
RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>::Mutable
          (RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
           *this)

{
  RepeatedPtrField<google::protobuf::Message> *this_00;
  iterator begin_iterator;
  iterator end_iterator;
  RepeatedPtrField<google::protobuf::Message> *rep;
  RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
  *this_local;
  
  this_00 = Reflection::MutableRepeatedPtrFieldInternal<google::protobuf::Message>
                      (this->reflection,this->message,this->field);
  begin_iterator = RepeatedPtrField<google::protobuf::Message>::begin(this_00);
  end_iterator = RepeatedPtrField<google::protobuf::Message>::end(this_00);
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_>::
  iterator_range((iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_>
                  *)&this_local,(RepeatedPtrIterator<google::protobuf::Message>)begin_iterator.it_,
                 (RepeatedPtrIterator<google::protobuf::Message>)end_iterator.it_);
  return _this_local;
}

Assistant:

iterator_range<typename RepeatedPtrField<FieldT>::iterator> Mutable() {
    auto& rep =
        *reflection->MutableRepeatedPtrFieldInternal<FieldT>(&message, field);
    return {rep.begin(), rep.end()};
  }